

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,unsigned_int>
          (Thread *this)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  uchar *__first;
  uchar *__last;
  uchar local_24 [8];
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  uint val;
  Thread *this_local;
  
  unique0x100000bd = this;
  result.v._8_4_ = Pop<unsigned_int>(this);
  __first = std::begin<unsigned_char,16ul>((uchar (*) [16])local_24);
  __last = std::end<unsigned_char,16ul>((uchar (*) [16])local_24);
  std::fill<unsigned_char*,unsigned_int>(__first,__last,(uint *)(result.v + 8));
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = local_24[0];
  value.v[1] = local_24[1];
  value.v[2] = local_24[2];
  value.v[3] = local_24[3];
  value.v[4] = local_24[4];
  value.v[5] = local_24[5];
  value.v[6] = local_24[6];
  value.v[7] = local_24[7];
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}